

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gls::BindReattachAttributeTest::iterate(BindReattachAttributeTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  void *pvVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  Cond local_1c0;
  string local_198;
  Attribute local_178;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  bindings;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  attributes;
  AttribType vec2;
  AttribType vec4;
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  reattachAttributes;
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  noBindings;
  
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  noBindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paVar1 = &local_178.m_type.m_name.field_2;
  local_178.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"vec4","");
  vec4.m_name._M_dataplus._M_p = (pointer)&vec4.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vec4,local_178.m_type.m_name._M_dataplus._M_p,
             local_178.m_type.m_name._M_dataplus._M_p + local_178.m_type.m_name._M_string_length);
  vec4.m_locationSize = 1;
  vec4.m_glTypeEnum = 0x8b52;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.m_type.m_name._M_dataplus._M_p,
                    local_178.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  local_178.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"vec2","");
  vec2.m_name._M_dataplus._M_p = (pointer)&vec2.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vec2,local_178.m_type.m_name._M_dataplus._M_p,
             local_178.m_type.m_name._M_dataplus._M_p + local_178.m_type.m_name._M_string_length);
  vec2.m_locationSize = 1;
  vec2.m_glTypeEnum = 0x8b50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.m_type.m_name._M_dataplus._M_p,
                    local_178.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  reattachAttributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  reattachAttributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  reattachAttributes.
  super__Vector_base<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"a_0","");
  paVar5 = &local_1c0.m_name.field_2;
  local_1c0.m_negate = true;
  local_1c0.m_name.field_2._M_allocated_capacity = 0x737961776c615f5f;
  local_1c0.m_name.field_2._8_2_ = 0x5f5f;
  local_1c0.m_name._M_string_length = 10;
  local_1c0.m_name.field_2._M_local_buf[10] = '\0';
  local_1c0.m_name._M_dataplus._M_p = (pointer)paVar5;
  AttributeLocationTestUtil::Attribute::Attribute(&local_178,&vec4,&local_198,-1,&local_1c0,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&attributes,&local_178);
  paVar2 = &local_178.m_cond.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_cond.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_178.m_cond.m_name._M_dataplus._M_p,
                    local_178.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_178.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_178.m_name._M_dataplus._M_p,
                    local_178.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.m_type.m_name._M_dataplus._M_p,
                    local_178.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.m_name._M_dataplus._M_p != paVar5) {
    operator_delete(local_1c0.m_name._M_dataplus._M_p,
                    local_1c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  pvVar4 = (void *)((long)&local_1c0 + 0x10);
  local_1c0._0_8_ = pvVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"a_0","");
  local_178.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_1c0._0_8_,
             local_1c0.m_name._M_dataplus._M_p + local_1c0._0_8_);
  local_178.m_type.m_locationSize = 1;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.m_type.m_name._M_dataplus._M_p,
                    local_178.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((void *)local_1c0._0_8_ != pvVar4) {
    operator_delete((void *)local_1c0._0_8_,local_1c0.m_name._M_string_length + 1);
  }
  local_1c0._0_8_ = pvVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"a_1","");
  local_178.m_type.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_1c0._0_8_,
             local_1c0.m_name._M_dataplus._M_p + local_1c0._0_8_);
  local_178.m_type.m_locationSize = 1;
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Bind>(&bindings,(Bind *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.m_type.m_name._M_dataplus._M_p,
                    local_178.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((void *)local_1c0._0_8_ != pvVar4) {
    operator_delete((void *)local_1c0._0_8_,local_1c0.m_name._M_string_length + 1);
  }
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"a_1","");
  local_1c0.m_negate = true;
  local_1c0.m_name.field_2._M_allocated_capacity = 0x737961776c615f5f;
  local_1c0.m_name.field_2._8_2_ = 0x5f5f;
  local_1c0.m_name._M_string_length = 10;
  local_1c0.m_name.field_2._M_local_buf[10] = '\0';
  local_1c0.m_name._M_dataplus._M_p = (pointer)paVar5;
  AttributeLocationTestUtil::Attribute::Attribute(&local_178,&vec2,&local_198,-1,&local_1c0,-1);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::emplace_back<deqp::gls::AttributeLocationTestUtil::Attribute>(&reattachAttributes,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_cond.m_name._M_dataplus._M_p != paVar2) {
    operator_delete(local_178.m_cond.m_name._M_dataplus._M_p,
                    local_178.m_cond.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_name._M_dataplus._M_p != paVar3) {
    operator_delete(local_178.m_name._M_dataplus._M_p,
                    local_178.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178.m_type.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_178.m_type.m_name._M_dataplus._M_p,
                    local_178.m_type.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0.m_name._M_dataplus._M_p != paVar5) {
    operator_delete(local_1c0.m_name._M_dataplus._M_p,
                    local_1c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  AttributeLocationTestUtil::runTest
            ((this->super_TestCase).super_TestNode.m_testCtx,this->m_renderCtx,&attributes,
             &noBindings,&bindings,&noBindings,false,true,&reattachAttributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&reattachAttributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Attribute,_std::allocator<deqp::gls::AttributeLocationTestUtil::Attribute>_>
  ::~vector(&attributes);
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&bindings);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vec2.m_name._M_dataplus._M_p != &vec2.m_name.field_2) {
    operator_delete(vec2.m_name._M_dataplus._M_p,vec2.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)vec4.m_name._M_dataplus._M_p != &vec4.m_name.field_2) {
    operator_delete(vec4.m_name._M_dataplus._M_p,vec4.m_name.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<deqp::gls::AttributeLocationTestUtil::Bind,_std::allocator<deqp::gls::AttributeLocationTestUtil::Bind>_>
  ::~vector(&noBindings);
  return STOP;
}

Assistant:

tcu::TestCase::IterateResult BindReattachAttributeTest::iterate (void)
{
	const vector<Bind>	noBindings;
	const AttribType	vec4("vec4", 1, GL_FLOAT_VEC4);
	const AttribType	vec2("vec2", 1, GL_FLOAT_VEC2);

	vector<Bind>		bindings;
	vector<Attribute>	attributes;
	vector<Attribute>	reattachAttributes;

	attributes.push_back(Attribute(vec4, "a_0"));
	bindings.push_back(Bind("a_0", 1));
	bindings.push_back(Bind("a_1", 1));

	reattachAttributes.push_back(Attribute(vec2, "a_1"));

	runTest(m_testCtx, m_renderCtx, attributes, noBindings, bindings, noBindings, false, true, reattachAttributes);
	return STOP;
}